

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.cpp
# Opt level: O0

void ximu::PacketEncoding::leftShiftBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  bool bVar1;
  reference pvVar2;
  byte *pbVar3;
  reference puVar4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_18;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  byteIt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_local;
  
  byteIt._M_current = (uchar *)v;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(v);
  *pvVar2 = *pvVar2 << 1;
  local_20._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(byteIt._M_current)
  ;
  local_18 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,1);
  while( true ) {
    local_28._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(byteIt._M_current)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_18);
    if ((*pbVar3 & 0x80) == 0x80) {
      local_30 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator-(&local_18,1);
      pbVar3 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_30);
      *pbVar3 = *pbVar3 | 1;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_18);
    *puVar4 = *puVar4 << 1;
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void PacketEncoding::leftShiftBytes(std::vector<unsigned char>& v) {
  v.front() <<= 1;

  for (auto byteIt = v.begin() + 1; byteIt != v.end(); ++byteIt) {
    if ((*byteIt & 0x80) == 0x80)
      *(byteIt - 1) |= 0x01;
    *byteIt <<= 1;
  }
}